

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::LowerTriangularLayerParams::SerializeWithCachedSizes
          (LowerTriangularLayerParams *this,CodedOutputStream *output)

{
  if (this->k_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->k_,output);
    return;
  }
  return;
}

Assistant:

void LowerTriangularLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.LowerTriangularLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 k = 1;
  if (this->k() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->k(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.LowerTriangularLayerParams)
}